

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O0

void __thiscall
cmFileMonitor::MonitorPaths
          (cmFileMonitor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,Callback *cb)

{
  cmIBaseWatcher *ps;
  bool bVar1;
  ulong uVar2;
  cmFileWatcher *pcVar3;
  size_t local_170;
  cmFileWatcher *local_160;
  cmRealDirectoryWatcher *local_148;
  cmRealDirectoryWatcher *local_118;
  byte local_e2;
  cmFileWatcher *filePtr;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
  local_c0;
  cmFileWatcher *local_a0;
  cmIBaseWatcher *nextWatcher;
  string *currentSegment;
  bool rootSegment;
  size_type sStack_88;
  bool fileSegment;
  size_t i;
  cmVirtualDirectoryWatcher *currentWatcher;
  ulong local_70;
  size_t segmentCount;
  bool pathIsFile;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathSegments;
  string *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Callback *cb_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  cmFileMonitor *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(paths);
  p = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(paths);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&p);
    if (!bVar1) {
      (*(this->Root->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher[5])
                ();
      return;
    }
    pathSegments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58);
    cmsys::SystemTools::SplitPath
              (pathSegments.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58,true);
    bVar1 = cmsys::SystemTools::FileIsDirectory
                      (pathSegments.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    segmentCount._3_1_ = (bVar1 ^ 0xffU) & 1;
    local_70 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_58);
    if (local_70 < 2) {
      currentWatcher._4_4_ = 3;
    }
    else {
      i = (size_t)this->Root;
      for (sStack_88 = 0; sStack_88 < local_70; sStack_88 = sStack_88 + 1) {
        if (i == 0) {
          __assert_fail("currentWatcher",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                        ,0x140,
                        "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                       );
        }
        local_e2 = 0;
        if (sStack_88 == local_70 - 1) {
          local_e2 = segmentCount._3_1_;
        }
        currentSegment._7_1_ = local_e2 & 1;
        currentSegment._6_1_ = sStack_88 == 0;
        if (currentSegment._7_1_ != 0 && (bool)currentSegment._6_1_) {
          __assert_fail("!(fileSegment && rootSegment)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                        ,0x146,
                        "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                       );
        }
        nextWatcher = (cmIBaseWatcher *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_58,sStack_88);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          local_a0 = (cmFileWatcher *)
                     cmVirtualDirectoryWatcher::Find
                               ((cmVirtualDirectoryWatcher *)i,(string *)nextWatcher);
          if (local_a0 == (cmFileWatcher *)0x0) {
            if ((currentSegment._6_1_ & 1) == 0) {
              if ((currentSegment._7_1_ & 1) == 0) {
                pcVar3 = (cmFileWatcher *)operator_new(0x70);
                if (i == 0) {
                  local_148 = (cmRealDirectoryWatcher *)0x0;
                }
                else {
                  local_148 = (cmRealDirectoryWatcher *)
                              __dynamic_cast(i,&cmVirtualDirectoryWatcher::typeinfo,
                                             &cmRealDirectoryWatcher::typeinfo,0);
                }
                cmDirectoryWatcher::cmDirectoryWatcher
                          ((cmDirectoryWatcher *)pcVar3,local_148,(string *)nextWatcher);
                local_a0 = pcVar3;
                pcVar3 = (cmFileWatcher *)
                         cmVirtualDirectoryWatcher::Find
                                   ((cmVirtualDirectoryWatcher *)i,(string *)nextWatcher);
                if (pcVar3 != local_a0) {
                  __assert_fail("currentWatcher->Find(currentSegment) == nextWatcher",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                                ,0x15d,
                                "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                               );
                }
              }
              else {
                if ((cmRootWatcher *)i == this->Root) {
                  __assert_fail("currentWatcher != this->Root",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                                ,0x154,
                                "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                               );
                }
                pcVar3 = (cmFileWatcher *)operator_new(0x48);
                if (i == 0) {
                  local_118 = (cmRealDirectoryWatcher *)0x0;
                }
                else {
                  local_118 = (cmRealDirectoryWatcher *)
                              __dynamic_cast(i,&cmVirtualDirectoryWatcher::typeinfo,
                                             &cmRealDirectoryWatcher::typeinfo,0);
                }
                ps = nextWatcher;
                std::
                function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
                ::function(&local_c0,cb);
                cmFileWatcher::cmFileWatcher(pcVar3,local_118,(string *)ps,&local_c0);
                local_a0 = pcVar3;
                std::
                function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
                ::~function(&local_c0);
                pcVar3 = (cmFileWatcher *)
                         cmVirtualDirectoryWatcher::Find
                                   ((cmVirtualDirectoryWatcher *)i,(string *)nextWatcher);
                if (pcVar3 != local_a0) {
                  __assert_fail("currentWatcher->Find(currentSegment) == nextWatcher",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                                ,0x158,
                                "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                               );
                }
              }
            }
            else {
              if ((cmRootWatcher *)i != this->Root) {
                __assert_fail("currentWatcher == this->Root",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                              ,0x150,
                              "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                             );
              }
              pcVar3 = (cmFileWatcher *)operator_new(0x70);
              cmRootDirectoryWatcher::cmRootDirectoryWatcher
                        ((cmRootDirectoryWatcher *)pcVar3,this->Root,(string *)nextWatcher);
              local_a0 = pcVar3;
              pcVar3 = (cmFileWatcher *)
                       cmVirtualDirectoryWatcher::Find
                                 ((cmVirtualDirectoryWatcher *)i,(string *)nextWatcher);
              if (pcVar3 != local_a0) {
                __assert_fail("currentWatcher->Find(currentSegment) == nextWatcher",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                              ,0x152,
                              "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                             );
              }
            }
          }
          else if ((currentSegment._7_1_ & 1) != 0) {
            if (local_a0 == (cmFileWatcher *)0x0) {
              local_160 = (cmFileWatcher *)0x0;
            }
            else {
              local_160 = (cmFileWatcher *)
                          __dynamic_cast(local_a0,&cmIBaseWatcher::typeinfo,&cmFileWatcher::typeinfo
                                         ,0);
            }
            if (local_160 == (cmFileWatcher *)0x0) {
              __assert_fail("filePtr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                            ,0x162,
                            "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                           );
            }
            cmFileWatcher::AppendCallback(local_160,cb);
            goto LAB_00160ddf;
          }
          if (local_a0 == (cmFileWatcher *)0x0) {
            local_170 = 0;
          }
          else {
            local_170 = __dynamic_cast(local_a0,&cmIBaseWatcher::typeinfo,
                                       &cmVirtualDirectoryWatcher::typeinfo,0);
          }
          i = local_170;
        }
LAB_00160ddf:
      }
      currentWatcher._4_4_ = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmFileMonitor::MonitorPaths(const std::vector<std::string>& paths,
                                 Callback const& cb)
{
  for (std::string const& p : paths) {
    std::vector<std::string> pathSegments;
    cmsys::SystemTools::SplitPath(p, pathSegments, true);
    const bool pathIsFile = !cmsys::SystemTools::FileIsDirectory(p);

    const size_t segmentCount = pathSegments.size();
    if (segmentCount < 2) { // Expect at least rootdir and filename
      continue;
    }
    cmVirtualDirectoryWatcher* currentWatcher = this->Root;
    for (size_t i = 0; i < segmentCount; ++i) {
      assert(currentWatcher);

      const bool fileSegment = (i == segmentCount - 1 && pathIsFile);
      const bool rootSegment = (i == 0);
      assert(
        !(fileSegment &&
          rootSegment)); // Can not be both filename and root part of the path!

      const std::string& currentSegment = pathSegments[i];
      if (currentSegment.empty()) {
        continue;
      }

      cmIBaseWatcher* nextWatcher = currentWatcher->Find(currentSegment);
      if (!nextWatcher) {
        if (rootSegment) { // Root part
          assert(currentWatcher == this->Root);
          nextWatcher = new cmRootDirectoryWatcher(this->Root, currentSegment);
          assert(currentWatcher->Find(currentSegment) == nextWatcher);
        } else if (fileSegment) { // File part
          assert(currentWatcher != this->Root);
          nextWatcher = new cmFileWatcher(
            dynamic_cast<cmRealDirectoryWatcher*>(currentWatcher),
            currentSegment, cb);
          assert(currentWatcher->Find(currentSegment) == nextWatcher);
        } else { // Any normal directory in between
          nextWatcher = new cmDirectoryWatcher(
            dynamic_cast<cmRealDirectoryWatcher*>(currentWatcher),
            currentSegment);
          assert(currentWatcher->Find(currentSegment) == nextWatcher);
        }
      } else {
        if (fileSegment) {
          auto filePtr = dynamic_cast<cmFileWatcher*>(nextWatcher);
          assert(filePtr);
          filePtr->AppendCallback(cb);
          continue;
        }
      }
      currentWatcher = dynamic_cast<cmVirtualDirectoryWatcher*>(nextWatcher);
    }
  }
  this->Root->StartWatching();
}